

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::ServiceDescriptorProto::IsInitialized(ServiceDescriptorProto *this)

{
  ServiceOptions *pSVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  lVar2 = (long)(this->method_).super_RepeatedPtrFieldBase.current_size_;
  do {
    lVar4 = lVar2;
    if (lVar4 < 1) goto LAB_002fa955;
    bVar3 = MethodDescriptorProto::IsInitialized
                      ((MethodDescriptorProto *)
                       ((this->method_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4 + -1]);
    lVar2 = lVar4 + -1;
  } while (bVar3);
  if (0 < lVar4) {
    return false;
  }
LAB_002fa955:
  if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
    pSVar1 = this->options_;
    bVar3 = internal::ExtensionSet::IsInitialized(&pSVar1->_extensions_);
    if (!bVar3) {
      return false;
    }
    bVar3 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                      (&pSVar1->uninterpreted_option_);
    if (!bVar3) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ServiceDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->method())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}